

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
DeviceObjectBase(DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
                TextureDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  int iVar2;
  size_t sVar3;
  IMemoryAllocator *pIVar4;
  char *pcVar5;
  undefined4 extraout_var_00;
  long lVar6;
  TextureDesc *pTVar7;
  TextureDesc *pTVar8;
  RenderDeviceGLImpl *this_00;
  byte bVar9;
  string msg;
  undefined4 extraout_var;
  
  bVar9 = 0;
  ObjectBase<Diligent::ITextureGL>::ObjectBase
            (&this->super_ObjectBase<Diligent::ITextureGL>,pRefCounters);
  (this->super_ObjectBase<Diligent::ITextureGL>).super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_003d23e8;
  this->m_pDevice = pDevice;
  pTVar7 = ObjDesc;
  pTVar8 = &this->m_Desc;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pTVar8->super_DeviceObjectAttribs).Name = (pTVar7->super_DeviceObjectAttribs).Name;
    pTVar7 = (TextureDesc *)((long)pTVar7 + (ulong)bVar9 * -0x10 + 8);
    pTVar8 = (TextureDesc *)((long)pTVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  if (pDevice == (RenderDeviceGLImpl *)0x0) {
    iVar2 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_UniqueId;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar2 = iVar2 + 1;
  }
  this->m_UniqueID = iVar2;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    this_00 = this->m_pDevice;
    if (this_00 == (RenderDeviceGLImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice != nullptr"
                 ,(char (*) [21])0x0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->m_pDevice;
    }
    RefCountedObject<Diligent::IRenderDeviceGL>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceGL> *)this_00);
  }
  pcVar5 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar5 == (char *)0x0) {
    pIVar4 = GetStringAllocator();
    iVar2 = (**pIVar4->_vptr_IMemoryAllocator)
                      (pIVar4,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    pcVar5 = (char *)CONCAT44(extraout_var_00,iVar2);
    snprintf(pcVar5,0x13,"0x%llX",this);
  }
  else {
    sVar3 = strlen(pcVar5);
    pIVar4 = GetStringAllocator();
    iVar2 = (**pIVar4->_vptr_IMemoryAllocator)
                      (pIVar4,sVar3 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    pcVar5 = (char *)CONCAT44(extraout_var,iVar2);
    memcpy(pcVar5,(ObjDesc->super_DeviceObjectAttribs).Name,sVar3 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar5;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }